

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_func.c
# Opt level: O1

void lj_func_closeuv(lua_State *L,TValue *level)

{
  uint uVar1;
  GCupval *uv;
  global_State *g;
  
  uVar1 = (L->openupval).gcptr32;
  if (uVar1 != 0) {
    g = (global_State *)(ulong)(L->glref).ptr32;
    do {
      uv = (GCupval *)(ulong)uVar1;
      if ((TValue *)(ulong)(uv->v).ptr32 < level) {
        return;
      }
      (L->openupval).gcptr32 = (uv->nextgc).gcptr32;
      if ((~(g->gc).currentwhite & uv->marked & 3) == 0) {
        *(uint32_t *)((ulong)(uv->field_5).field_1.next.gcptr32 + 8) =
             (uv->field_5).field_1.prev.gcptr32;
        *(uint32_t *)((ulong)(uv->field_5).field_1.prev.gcptr32 + 0xc) =
             (uv->field_5).field_1.next.gcptr32;
        lj_gc_closeuv(g,uv);
      }
      else {
        lj_func_freeuv(g,uv);
      }
      uVar1 = (L->openupval).gcptr32;
    } while (uVar1 != 0);
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_func_closeuv(lua_State *L, TValue *level)
{
  GCupval *uv;
  global_State *g = G(L);
  while (gcref(L->openupval) != NULL &&
	 uvval((uv = gco2uv(gcref(L->openupval)))) >= level) {
    GCobj *o = obj2gco(uv);
    lj_assertG(!isblack(o), "bad black upvalue");
    lj_assertG(!uv->closed && uvval(uv) != &uv->tv, "closed upvalue in chain");
    setgcrefr(L->openupval, uv->nextgc);  /* No longer in open list. */
    if (isdead(g, o)) {
      lj_func_freeuv(g, uv);
    } else {
      unlinkuv(g, uv);
      lj_gc_closeuv(g, uv);
    }
  }
}